

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O1

void __thiscall
Address_ElementsSourceDataConstructorTest_Test::TestBody
          (Address_ElementsSourceDataConstructorTest_Test *this)

{
  pointer pcVar1;
  pointer puVar2;
  _Alloc_hider *lhs;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  _Alloc_hider lhs_00;
  NetType NVar4;
  bool bVar5;
  long *__dest;
  pointer paVar6;
  char *pcVar7;
  char *in_R9;
  ulong uVar8;
  size_t __n;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_4;
  ByteData hash;
  AssertionResult gtest_ar_1;
  ElementsUnblindedAddressTestVector test;
  Address addr;
  ByteData160 local_428;
  string local_410;
  AssertHelper local_3f0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e8;
  ByteData local_3e0;
  _func_int **local_3c8;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *local_3c0;
  Script *local_3b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3b0;
  _Alloc_hider *local_3a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_3a0;
  _Alloc_hider a_Stack_398 [2];
  char local_388 [16];
  pointer local_378;
  pointer local_360;
  pointer local_348;
  TapBranch local_330;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_2b8;
  Script local_2a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  string local_228;
  undefined8 local_208;
  Pubkey local_200;
  Script local_1e8;
  pointer local_1b0;
  Address local_1a8;
  
  cfd::core::Address::Address(&local_1a8);
  local_1b0 = test_vectors.
              super__Vector_base<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (test_vectors.
      super__Vector_base<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      test_vectors.
      super__Vector_base<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_3b0 = &local_260;
    local_3b8 = &local_2a0;
    local_3c0 = &local_2b8;
    local_3c8 = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
    paVar6 = test_vectors.
             super__Vector_base<ElementsUnblindedAddressTestVector,_std::allocator<ElementsUnblindedAddressTestVector>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      pcVar1 = (paVar6->address)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_228,pcVar1,pcVar1 + (paVar6->address)._M_string_length);
      local_208._0_4_ = paVar6->net_type;
      local_208._4_4_ = paVar6->addr_type;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_200,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&paVar6->pubkey);
      cfd::core::Script::Script(&local_1e8,&paVar6->script);
      cfd::core::ByteData::ByteData(&local_3e0);
      if (local_208._4_4_ - 3U < 2) {
        cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&local_3a8,&local_200);
        sVar3.ptr_ = sStack_3a0.ptr_;
        if (local_3a8 != a_Stack_398) {
          operator_delete(local_3a8);
        }
        if (sVar3.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          bVar5 = testing::internal::AlwaysTrue();
          if (bVar5) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5) {
              NVar4 = (NetType)local_208;
              cfd::core::GetElementsAddressFormatList();
              cfd::core::Address::Address
                        ((Address *)&local_3a8,NVar4,kVersion0,&local_200,
                         (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          *)&local_410);
              cfd::core::Address::operator=(&local_1a8,(Address *)&local_3a8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_3b0);
              cfd::core::Script::~Script(local_3b8);
              local_330._vptr_TapBranch = local_3c8;
              std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                        (local_3c0);
              cfd::core::TapBranch::~TapBranch(&local_330);
              if (local_348 != (pointer)0x0) {
                operator_delete(local_348);
              }
              if (local_360 != (pointer)0x0) {
                operator_delete(local_360);
              }
              if (local_378 != (pointer)0x0) {
                operator_delete(local_378);
              }
              if (a_Stack_398[0]._M_p != local_388) {
                operator_delete(a_Stack_398[0]._M_p);
              }
              std::
              vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
              ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       *)&local_410);
            }
          }
          else {
            testing::Message::Message((Message *)&local_3a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_410,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                       ,0x395,
                       "Expected: (addr = Address(test.net_type, WitnessVersion::kVersion0, test.pubkey, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                      );
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_410,(Message *)&local_3a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_410);
            if (local_3a8 != (_Alloc_hider *)0x0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) && (local_3a8 != (_Alloc_hider *)0x0)) {
                (**(code **)(local_3a8->_M_p + 8))();
              }
              local_3a8 = (_Alloc_hider *)0x0;
            }
          }
          cfd::core::HashUtil::Hash160(&local_428,&local_200);
          cfd::core::ByteData160::GetBytes
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410,&local_428)
          ;
          cfd::core::ByteData::ByteData
                    ((ByteData *)&local_3a8,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410);
          goto LAB_002f6184;
        }
        cfd::core::Script::GetHex_abi_cxx11_((string *)&local_3a8,&local_1e8);
        sVar3.ptr_ = sStack_3a0.ptr_;
        if (local_3a8 != a_Stack_398) {
          operator_delete(local_3a8);
        }
        if (sVar3.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          bVar5 = testing::internal::AlwaysTrue();
          if (bVar5) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5) {
              NVar4 = (NetType)local_208;
              cfd::core::GetElementsAddressFormatList();
              cfd::core::Address::Address
                        ((Address *)&local_3a8,NVar4,kVersion0,&local_1e8,
                         (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          *)&local_410);
              cfd::core::Address::operator=(&local_1a8,(Address *)&local_3a8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_3b0);
              cfd::core::Script::~Script(local_3b8);
              local_330._vptr_TapBranch = local_3c8;
              std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                        (local_3c0);
              cfd::core::TapBranch::~TapBranch(&local_330);
              if (local_348 != (pointer)0x0) {
                operator_delete(local_348);
              }
              if (local_360 != (pointer)0x0) {
                operator_delete(local_360);
              }
              if (local_378 != (pointer)0x0) {
                operator_delete(local_378);
              }
              if (a_Stack_398[0]._M_p != local_388) {
                operator_delete(a_Stack_398[0]._M_p);
              }
              std::
              vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
              ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       *)&local_410);
            }
          }
          else {
            testing::Message::Message((Message *)&local_3a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_410,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                       ,0x39c,
                       "Expected: (addr = Address(test.net_type, WitnessVersion::kVersion0, test.script, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                      );
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_410,(Message *)&local_3a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_410);
            if (local_3a8 != (_Alloc_hider *)0x0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) && (local_3a8 != (_Alloc_hider *)0x0)) {
                (**(code **)(local_3a8->_M_p + 8))();
              }
              local_3a8 = (_Alloc_hider *)0x0;
            }
          }
          cfd::core::HashUtil::Sha256((ByteData256 *)&local_428,&local_1e8);
          cfd::core::ByteData256::GetBytes
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410,
                     (ByteData256 *)&local_428);
          cfd::core::ByteData::ByteData
                    ((ByteData *)&local_3a8,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410);
          goto LAB_002f6184;
        }
        local_410._M_dataplus._M_p = local_410._M_dataplus._M_p & 0xffffffffffffff00;
        local_410._M_string_length = 0;
        testing::Message::Message((Message *)&local_428);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_3a8,(internal *)&local_410,(AssertionResult *)0x59a629,"true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                   ,0x3a0,(char *)local_3a8);
        testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&local_428);
        testing::internal::AssertHelper::~AssertHelper(&local_3f0);
        if (local_3a8 != a_Stack_398) {
          operator_delete(local_3a8);
        }
        if ((long *)local_428.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) &&
             ((long *)local_428.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (long *)0x0)) {
            (**(code **)(*(long *)local_428.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
          local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_410._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&local_3a8,&local_200);
        sVar3.ptr_ = sStack_3a0.ptr_;
        if (local_3a8 != a_Stack_398) {
          operator_delete(local_3a8);
        }
        if (sVar3.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          cfd::core::Script::GetHex_abi_cxx11_((string *)&local_3a8,&local_1e8);
          sVar3.ptr_ = sStack_3a0.ptr_;
          if (local_3a8 != a_Stack_398) {
            operator_delete(local_3a8);
          }
          if (sVar3.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            local_410._M_dataplus._M_p = local_410._M_dataplus._M_p & 0xffffffffffffff00;
            local_410._M_string_length = 0;
            testing::Message::Message((Message *)&local_428);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_3a8,(internal *)&local_410,(AssertionResult *)0x59a629,
                       "true","false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_3f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                       ,0x3ae,(char *)local_3a8);
            testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&local_428);
            testing::internal::AssertHelper::~AssertHelper(&local_3f0);
            if (local_3a8 != a_Stack_398) {
              operator_delete(local_3a8);
            }
            if ((long *)local_428.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start != (long *)0x0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) &&
                 ((long *)local_428.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start != (long *)0x0)) {
                (**(code **)(*(long *)local_428.data_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 8))();
              }
              local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_410._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_002f61f3;
          }
          bVar5 = testing::internal::AlwaysTrue();
          if (bVar5) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5) {
              NVar4 = (NetType)local_208;
              cfd::core::GetElementsAddressFormatList();
              cfd::core::Address::Address
                        ((Address *)&local_3a8,NVar4,&local_1e8,
                         (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          *)&local_410);
              cfd::core::Address::operator=(&local_1a8,(Address *)&local_3a8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_3b0);
              cfd::core::Script::~Script(local_3b8);
              local_330._vptr_TapBranch = local_3c8;
              std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                        (local_3c0);
              cfd::core::TapBranch::~TapBranch(&local_330);
              if (local_348 != (pointer)0x0) {
                operator_delete(local_348);
              }
              if (local_360 != (pointer)0x0) {
                operator_delete(local_360);
              }
              if (local_378 != (pointer)0x0) {
                operator_delete(local_378);
              }
              if (a_Stack_398[0]._M_p != local_388) {
                operator_delete(a_Stack_398[0]._M_p);
              }
              std::
              vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
              ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       *)&local_410);
            }
          }
          else {
            testing::Message::Message((Message *)&local_3a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_410,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                       ,0x3aa,
                       "Expected: (addr = Address(test.net_type, test.script, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                      );
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_410,(Message *)&local_3a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_410);
            if (local_3a8 != (_Alloc_hider *)0x0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) && (local_3a8 != (_Alloc_hider *)0x0)) {
                (**(code **)(local_3a8->_M_p + 8))();
              }
              local_3a8 = (_Alloc_hider *)0x0;
            }
          }
          cfd::core::HashUtil::Hash160(&local_428,&local_1e8);
          cfd::core::ByteData160::GetBytes
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410,&local_428)
          ;
          cfd::core::ByteData::ByteData
                    ((ByteData *)&local_3a8,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410);
        }
        else {
          bVar5 = testing::internal::AlwaysTrue();
          if (bVar5) {
            bVar5 = testing::internal::AlwaysTrue();
            if (bVar5) {
              NVar4 = (NetType)local_208;
              cfd::core::GetElementsAddressFormatList();
              cfd::core::Address::Address
                        ((Address *)&local_3a8,NVar4,&local_200,
                         (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          *)&local_410);
              cfd::core::Address::operator=(&local_1a8,(Address *)&local_3a8);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(local_3b0);
              cfd::core::Script::~Script(local_3b8);
              local_330._vptr_TapBranch = local_3c8;
              std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                        (local_3c0);
              cfd::core::TapBranch::~TapBranch(&local_330);
              if (local_348 != (pointer)0x0) {
                operator_delete(local_348);
              }
              if (local_360 != (pointer)0x0) {
                operator_delete(local_360);
              }
              if (local_378 != (pointer)0x0) {
                operator_delete(local_378);
              }
              if (a_Stack_398[0]._M_p != local_388) {
                operator_delete(a_Stack_398[0]._M_p);
              }
              std::
              vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
              ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                       *)&local_410);
            }
          }
          else {
            testing::Message::Message((Message *)&local_3a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_410,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                       ,0x3a5,
                       "Expected: (addr = Address(test.net_type, test.pubkey, GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
                      );
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_410,(Message *)&local_3a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_410);
            if (local_3a8 != (_Alloc_hider *)0x0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) && (local_3a8 != (_Alloc_hider *)0x0)) {
                (**(code **)(local_3a8->_M_p + 8))();
              }
              local_3a8 = (_Alloc_hider *)0x0;
            }
          }
          cfd::core::HashUtil::Hash160(&local_428,&local_200);
          cfd::core::ByteData160::GetBytes
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410,&local_428)
          ;
          cfd::core::ByteData::ByteData
                    ((ByteData *)&local_3a8,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_410);
        }
LAB_002f6184:
        puVar2 = local_3e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_3e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_3a8;
        local_3e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)sStack_3a0.ptr_;
        local_3e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)a_Stack_398[0]._M_p;
        local_3a8 = (_Alloc_hider *)0x0;
        sStack_3a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        a_Stack_398[0]._M_p = (char *)0x0;
        if ((_Alloc_hider *)puVar2 != (_Alloc_hider *)0x0) {
          operator_delete(puVar2);
        }
        if (local_3a8 != (_Alloc_hider *)0x0) {
          operator_delete(local_3a8);
        }
        if ((long *)local_410._M_dataplus._M_p != (long *)0x0) {
          operator_delete(local_410._M_dataplus._M_p);
        }
        if ((long *)local_428.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0) {
          operator_delete(local_428.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
LAB_002f61f3:
      cfd::core::GetElementsAddressFormatList();
      bVar5 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress
                        (&local_228,
                         (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                          *)&local_3a8);
      local_410._M_dataplus._M_p._0_1_ = !bVar5;
      local_410._M_string_length = 0;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&local_3a8);
      if ((char)local_410._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_428);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_3a8,(internal *)&local_410,
                   (AssertionResult *)
                   "ElementsConfidentialAddress::IsConfidentialAddress(test.address, GetElementsAddressFormatList())"
                   ,"true","false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                   ,0x3b2,(char *)local_3a8);
        testing::internal::AssertHelper::operator=(&local_3f0,(Message *)&local_428);
        testing::internal::AssertHelper::~AssertHelper(&local_3f0);
        if (local_3a8 != a_Stack_398) {
          operator_delete(local_3a8);
        }
        if ((long *)local_428.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (long *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) &&
             ((long *)local_428.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (long *)0x0)) {
            (**(code **)(*(long *)local_428.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 8))();
          }
          local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_410._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lhs_00._M_p = local_228._M_dataplus._M_p;
      cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_3a8,&local_1a8);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_410,"test.address.c_str()","addr.GetAddress().c_str()",
                 lhs_00._M_p,(char *)local_3a8);
      if (local_3a8 != a_Stack_398) {
        operator_delete(local_3a8);
      }
      if ((char)local_410._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_3a8);
        pcVar7 = "";
        if ((undefined8 *)local_410._M_string_length != (undefined8 *)0x0) {
          pcVar7 = *(char **)local_410._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_428,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                   ,0x3b3,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_428,(Message *)&local_3a8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
        if (local_3a8 != (_Alloc_hider *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) && (local_3a8 != (_Alloc_hider *)0x0)) {
            (**(code **)(local_3a8->_M_p + 8))();
          }
          local_3a8 = (_Alloc_hider *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_410._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_208._4_4_ - 5U < 2) {
        local_410._M_dataplus._M_p._0_4_ = 1;
        local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_428.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,local_1a8.addr_type_);
        testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
                  ((internal *)&local_3a8,"AddressType::kP2shAddress","addr.GetAddressType()",
                   (AddressType *)&local_410,(AddressType *)&local_428);
        if (local_3a8._0_1_ == kCfdSuccess) {
          testing::Message::Message((Message *)&local_410);
          pcVar7 = "";
          if (sStack_3a0.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_428,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                     ,0x3b7,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_428,(Message *)&local_410);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
          if ((long *)local_410._M_dataplus._M_p != (long *)0x0) {
            bVar5 = testing::internal::IsTrue(true);
            if ((bVar5) && ((long *)local_410._M_dataplus._M_p != (long *)0x0)) {
              (**(code **)(*(long *)local_410._M_dataplus._M_p + 8))();
            }
            local_410._M_dataplus._M_p = (pointer)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
      }
      else {
        local_410._M_dataplus._M_p._0_4_ = local_1a8.addr_type_;
        testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
                  ((internal *)&local_3a8,"test.addr_type","addr.GetAddressType()",
                   (AddressType *)((long)&local_208 + 4),(AddressType *)&local_410);
        if (local_3a8._0_1_ == kCfdSuccess) {
          testing::Message::Message((Message *)&local_410);
          pcVar7 = "";
          if (sStack_3a0.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar7 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_428,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                     ,0x3ba,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_428,(Message *)&local_410);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
          if ((long *)local_410._M_dataplus._M_p != (long *)0x0) {
            bVar5 = testing::internal::IsTrue(true);
            if ((bVar5) && ((long *)local_410._M_dataplus._M_p != (long *)0x0)) {
              (**(code **)(*(long *)local_410._M_dataplus._M_p + 8))();
            }
            local_410._M_dataplus._M_p = (pointer)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
      }
      local_410._M_dataplus._M_p._0_4_ = local_1a8.type_;
      testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
                ((internal *)&local_3a8,"test.net_type","addr.GetNetType()",(NetType *)&local_208,
                 (NetType *)&local_410);
      if (local_3a8._0_1_ == kCfdSuccess) {
        testing::Message::Message((Message *)&local_410);
        pcVar7 = "";
        if (sStack_3a0.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((sStack_3a0.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_428,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                   ,0x3bd,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_428,(Message *)&local_410)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
        if ((long *)local_410._M_dataplus._M_p != (long *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) && ((long *)local_410._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_410._M_dataplus._M_p + 8))();
          }
          local_410._M_dataplus._M_p = (pointer)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&sStack_3a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_3a8,&local_3e0);
      lhs = local_3a8;
      local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar8 = (long)local_1a8.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1a8.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar8 == 0) {
        __dest = (long *)0x0;
      }
      else {
        if ((long)uVar8 < 0) {
          std::__throw_bad_alloc();
        }
        __dest = (long *)operator_new(uVar8);
      }
      local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)((long)__dest + uVar8);
      __n = (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_1a8.hash_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)__dest;
      if (__n != 0) {
        local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)__dest;
        memmove(__dest,local_1a8.hash_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,__n);
      }
      local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((long)__dest + __n);
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_410,(ByteData *)&local_428);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_3f0,"hash.GetHex().c_str()","addr.GetHash().GetHex().c_str()",
                 (char *)lhs,local_410._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p);
      }
      if ((long *)local_428.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
        operator_delete(local_428.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_3a8 != a_Stack_398) {
        operator_delete(local_3a8);
      }
      if (local_3f0.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_3a8);
        pcVar7 = "";
        if (local_3e8.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((local_3e8.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_410,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_address.cpp"
                   ,0x3be,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_410,(Message *)&local_3a8)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_410);
        if (local_3a8 != (_Alloc_hider *)0x0) {
          bVar5 = testing::internal::IsTrue(true);
          if ((bVar5) && (local_3a8 != (_Alloc_hider *)0x0)) {
            (**(code **)(local_3a8->_M_p + 8))();
          }
          local_3a8 = (_Alloc_hider *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_3e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if ((_Alloc_hider *)
          local_3e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (_Alloc_hider *)0x0) {
        operator_delete(local_3e0.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::Script::~Script(&local_1e8);
      if (local_200.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      paVar6 = paVar6 + 1;
    } while (paVar6 != local_1b0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1a8.format_data_);
  cfd::core::Script::~Script(&local_1a8.redeem_script_);
  local_1a8.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_006a68b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_1a8.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_1a8.script_tree_.super_TapBranch);
  if (local_1a8.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1a8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.address_._M_dataplus._M_p != &local_1a8.address_.field_2) {
    operator_delete(local_1a8.address_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Address, ElementsSourceDataConstructorTest) {
  Address addr;
  for (ElementsUnblindedAddressTestVector test : test_vectors) {
    // pubkey/script constructor
    {
      ByteData hash;
      if ((test.addr_type == AddressType::kP2wpkhAddress)
          || (test.addr_type == AddressType::kP2wshAddress)) {
        // p2pkh constructor
        if (!test.pubkey.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type,
              WitnessVersion::kVersion0, test.pubkey,
              GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.pubkey).GetBytes());
        }
        // p2sh constructor
        else if (!test.script.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type,
              WitnessVersion::kVersion0, test.script,
              GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Sha256(test.script).GetBytes());
        }
        else {
          EXPECT_FALSE(true);
        }
      } else {
        // p2pkh constructor
        if (!test.pubkey.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type, test.pubkey, GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.pubkey).GetBytes());
        }
        // p2sh constructor
        else if (!test.script.GetHex().empty()) {
          EXPECT_NO_THROW((addr = Address(test.net_type, test.script, GetElementsAddressFormatList())));
          hash = ByteData(HashUtil::Hash160(test.script).GetBytes());
        }
        else {
          EXPECT_FALSE(true);
        }
      }

      EXPECT_FALSE(ElementsConfidentialAddress::IsConfidentialAddress(test.address, GetElementsAddressFormatList()));
      EXPECT_STREQ(test.address.c_str(), addr.GetAddress().c_str());
      switch (test.addr_type) {
        case AddressType::kP2shP2wshAddress:
        case AddressType::kP2shP2wpkhAddress:
          EXPECT_EQ(AddressType::kP2shAddress, addr.GetAddressType());
          break;
        default:
          EXPECT_EQ(test.addr_type, addr.GetAddressType());
          break;
      }
      EXPECT_EQ(test.net_type, addr.GetNetType());
      EXPECT_STREQ(hash.GetHex().c_str(), addr.GetHash().GetHex().c_str());
    }
  }
}